

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::utils::RateLimiter_testMaxBalance_Test::TestBody
          (RateLimiter_testMaxBalance_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult local_168 [2];
  AssertHelper local_148 [8];
  Message local_140 [15];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_100 [8];
  Message local_f8 [15];
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  duration<long,std::ratio<1l,1l>> local_d0 [8];
  duration local_c8;
  uint local_bc;
  AssertionResult local_b8 [2];
  AssertHelper local_98 [8];
  Message local_90 [31];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> limiter;
  time_point timestamp;
  RateLimiter_testMaxBalance_Test *this_local;
  
  (anonymous_namespace)::currentTime.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)(anonymous_namespace)::currentTime.__d.__r;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::RateLimiter
            ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
             &gtest_ar_.message_,0.1,1.0);
  local_71 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                       ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                        &gtest_ar_.message_,1.0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_b8,local_70,"limiter.checkCredit(1.0)","false");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::Message::~Message(local_90);
  }
  local_bc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (local_bc == 0) {
    gtest_ar__1.message_.ptr_._4_4_ = 0x14;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              (local_d0,(int *)((long)&gtest_ar__1.message_.ptr_ + 4));
    (anonymous_namespace)::currentTime =
         std::chrono::operator+
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                    (duration<long,_std::ratio<1L,_1L>_> *)local_d0);
    local_c8 = (anonymous_namespace)::currentTime.__d.__r;
    local_e9 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                         ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                          &gtest_ar_.message_,1.0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_e8,&local_e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&gtest_ar__2.message_,local_e8,"limiter.checkCredit(1.0)",
                 "false");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x4b,pcVar2);
      testing::internal::AssertHelper::operator=(local_100,local_f8);
      testing::internal::AssertHelper::~AssertHelper(local_100);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(local_f8);
    }
    local_bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    if (local_bc == 0) {
      local_131 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                            ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                             &gtest_ar_.message_,1.0);
      local_131 = !local_131;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_130,&local_131,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar1) {
        testing::Message::Message(local_140);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_168,local_130,"limiter.checkCredit(1.0)","true");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                   ,0x4c,pcVar2);
        testing::internal::AssertHelper::operator=(local_148,local_140);
        testing::internal::AssertHelper::~AssertHelper(local_148);
        std::__cxx11::string::~string((string *)local_168);
        testing::Message::~Message(local_140);
      }
      local_bc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    }
  }
  return;
}

Assistant:

TEST(RateLimiter, testMaxBalance)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(0.1, 1.0);

    ASSERT_TRUE(limiter.checkCredit(1.0));

    currentTime = timestamp + std::chrono::seconds(20);
    ASSERT_TRUE(limiter.checkCredit(1.0));
    ASSERT_FALSE(limiter.checkCredit(1.0));
}